

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clikit.h
# Opt level: O0

void __thiscall
clikit::ProcessOptions::operator()
          (ProcessOptions *this,
          vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
          *optionDefinitions)

{
  anon_class_16_2_6c671130 __f;
  bool bVar1;
  reference this_00;
  iterator iVar2;
  iterator iVar3;
  iterator __first;
  iterator __last;
  size_type sVar4;
  pointer pOVar5;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  local_1c0;
  OptionDefinition *local_1b8;
  OptionDefinition *local_1b0;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  local_1a8;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  local_1a0;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  definitionItr;
  Option *option_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<clikit::Option,_std::allocator<clikit::Option>_> *__range2_1;
  allocator<char> local_141;
  undefined1 local_140 [8];
  Option badOption;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  local_e8;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  badOptionItr;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  local_c0;
  __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
  firstArgsItr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  reference local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  OptionDefinition *option;
  iterator __end2;
  iterator __begin2;
  vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_> *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  definedOptions;
  vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>
  *optionDefinitions_local;
  ProcessOptions *this_local;
  
  definedOptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)optionDefinitions;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range2);
  __end2 = std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::begin
                     (optionDefinitions);
  option = (OptionDefinition *)
           std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::end
                     (optionDefinitions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
                                     *)&option), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
              ::operator*(&__end2);
    __end3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this_00->names);
    name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this_00->names);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&name), bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2,local_70);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_98,&this_00->names);
    std::__cxx11::string::string((string *)&firstArgsItr,(string *)&this_00->usage);
    Usage::add((Usage *)usage,&local_98,(string *)&firstArgsItr);
    std::__cxx11::string::~string((string *)&firstArgsItr);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    __gnu_cxx::
    __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
    ::operator++(&__end2);
  }
  iVar2 = std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::begin
                    (optionDefinitions);
  iVar3 = std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::end
                    (optionDefinitions);
  local_c0 = std::operator()(iVar2._M_current,iVar3._M_current);
  badOptionItr._M_current =
       (OptionDefinition *)
       std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::end
                 (optionDefinitions);
  bVar1 = __gnu_cxx::operator!=(&local_c0,&badOptionItr);
  if (bVar1) {
    pOVar5 = __gnu_cxx::
             __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
             ::operator->(&local_c0);
    std::
    function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::operator()(&pOVar5->lambda,&(this->_firstArgs).arguments);
  }
  iVar2 = std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::begin
                    (optionDefinitions);
  iVar3 = std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::end
                    (optionDefinitions);
  local_e8 = std::operator()(iVar2._M_current,iVar3._M_current);
  badOption.arguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::
                end(optionDefinitions);
  bVar1 = __gnu_cxx::operator!=
                    (&local_e8,
                     (__normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
                      *)&badOption.arguments.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_140,"Bad options",&local_141)
    ;
    badOption.name.field_2._8_8_ = 0;
    badOption.arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    badOption.arguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&badOption.name.field_2 + 8));
    std::allocator<char>::~allocator(&local_141);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(&this->_commandLine);
    __last = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->_commandLine);
    __f.badOption = (Option *)local_140;
    __f.definedOptions =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range2;
    std::operator()((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )__first._M_current,
                    (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )__last._M_current,__f);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&badOption.name.field_2 + 8));
    if (sVar4 != 0) {
      pOVar5 = __gnu_cxx::
               __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
               ::operator->(&local_e8);
      std::
      function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()(&pOVar5->lambda,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&badOption.name.field_2 + 8));
    }
    Option::~Option((Option *)local_140);
  }
  __end2_1 = std::vector<clikit::Option,_std::allocator<clikit::Option>_>::begin(&this->_options);
  option_1 = (Option *)
             std::vector<clikit::Option,_std::allocator<clikit::Option>_>::end(&this->_options);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2_1,
                            (__normal_iterator<clikit::Option_*,_std::vector<clikit::Option,_std::allocator<clikit::Option>_>_>
                             *)&option_1), bVar1) {
    definitionItr._M_current =
         (OptionDefinition *)
         __gnu_cxx::
         __normal_iterator<clikit::Option_*,_std::vector<clikit::Option,_std::allocator<clikit::Option>_>_>
         ::operator*(&__end2_1);
    local_1a8._M_current =
         (OptionDefinition *)
         std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::begin
                   (optionDefinitions);
    local_1b0 = (OptionDefinition *)
                std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::
                end(optionDefinitions);
    local_1b8 = definitionItr._M_current;
    local_1a0 = std::operator()(local_1a8,
                                (__normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
                                 )local_1b0,definitionItr._M_current);
    local_1c0._M_current =
         (OptionDefinition *)
         std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>::end
                   (optionDefinitions);
    bVar1 = __gnu_cxx::operator!=(&local_1a0,&local_1c0);
    if (bVar1) {
      pOVar5 = __gnu_cxx::
               __normal_iterator<clikit::OptionDefinition_*,_std::vector<clikit::OptionDefinition,_std::allocator<clikit::OptionDefinition>_>_>
               ::operator->(&local_1a0);
      std::
      function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
      ::operator()(&pOVar5->lambda,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&((definitionItr._M_current)->lambda).super__Function_base._M_functor +
                      8));
    }
    __gnu_cxx::
    __normal_iterator<clikit::Option_*,_std::vector<clikit::Option,_std::allocator<clikit::Option>_>_>
    ::operator++(&__end2_1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range2);
  return;
}

Assistant:

void operator()(vector<OptionDefinition> optionDefinitions)
        {
            vector<string> definedOptions;

            // List defined options to know when to call "Bad Options"
            for (auto& option : optionDefinitions)
            {
                for (auto& name : option.names)
                {
                    definedOptions.push_back(name);
                }

                usage.add(option.names, option.usage);
            }

            // Check if "First args" is present
            auto firstArgsItr = find_if(ALL(optionDefinitions), [&](const OptionDefinition& definition)
            {
                return find(ALL(definition.names), "First args") != definition.names.end();
            });

            if (firstArgsItr != optionDefinitions.end())
            {
                firstArgsItr->lambda(_firstArgs.arguments);
            }

            // Check if "Bad Options" is present
            auto badOptionItr = find_if(ALL(optionDefinitions), [&](const OptionDefinition& definition)
            {
                return find(ALL(definition.names), "Bad options") != definition.names.end();
            });

            if (badOptionItr != optionDefinitions.end())
            {
                Option badOption{ "Bad options" };

                // List bad options names as "Bad Options" arguments
                for_each(_commandLine.begin(), _commandLine.end(), [&](string& arg)
                {
                    if (arg[0] == '-' && find(ALL(definedOptions), arg) == definedOptions.end())
                    {
                        badOption.arguments.push_back(arg);
                    }
                });

                // Run "Bad Options" lambda
                if (badOption.arguments.size())
                {
                    badOptionItr->lambda(badOption.arguments);
                }
            }

            // Process valid options
            for (auto& option : _options)
            {
                // For each defined options found in argv
                auto definitionItr = find_if(ALL(optionDefinitions), [&](const OptionDefinition& definition)
                {
                    return find_if(ALL(definition.names), 
                        [&](const string& definitionName) 
                        { 
                            return option.name == definitionName; 
                        }) != definition.names.end();
                });

                // Run option lambda
                if (definitionItr != optionDefinitions.end())
                {
                    definitionItr->lambda(option.arguments);
                }
            }
        }